

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,uint32_t result_id
          )

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar1;
  size_t sVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  const_iterator cVar5;
  mapped_type *name;
  SPIRBlock *pSVar6;
  undefined1 *puVar7;
  char (*pacVar8) [4];
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar9;
  long lVar10;
  size_t sVar11;
  __hashtable *__h;
  __node_gen_type __node_gen;
  TypedID<(spirv_cross::Types)0> local_8c;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_88 [2];
  undefined1 local_78 [32];
  char *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_8c.id = result_id;
  local_78._24_8_ =
       Variant::get<spirv_cross::SPIRType>
                 ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                  result_type);
  this_00 = &(this->super_Compiler).ir.meta;
  local_88[0] = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)CONCAT44(local_88[0]._4_4_,result_id);
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)local_88);
  if (this->current_continue_block == (SPIRBlock *)0x0) {
LAB_001c4aac:
    cVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_Compiler).hoisted_temporaries._M_h,&local_8c.id);
    if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      local_88[0] = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)CONCAT44(local_88[0]._4_4_,local_8c.id);
      local_78._16_8_ = __return_storage_ptr__;
      name = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)local_88);
      add_variable(this,&this->local_variable_names,&this->block_names,(string *)name);
      uVar3 = local_78._24_8_;
      local_58 = flags_to_qualifiers_glsl
                           (this,(SPIRType *)local_78._24_8_,&(pmVar4->decoration).decoration_flags)
      ;
      (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)local_8c.id,1);
      pacVar8 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_88,this,uVar3,local_50);
      __return_storage_ptr__ = (string *)local_78._16_8_;
      join<char_const*,std::__cxx11::string,char_const(&)[4]>
                ((string *)local_78._16_8_,(spirv_cross *)&local_58,(char **)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f38c7,
                 pacVar8);
      if (local_88[0] !=
          (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_78) {
        operator_delete(local_88[0]);
      }
      puVar7 = local_40;
      goto LAB_001c4d2e;
    }
    pacVar8 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_88,this,(ulong)local_8c.id);
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f38c7,pacVar8
              );
  }
  else {
    this_01 = &(this->super_Compiler).hoisted_temporaries;
    cVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_01->_M_h,&local_8c.id);
    if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_001c4aac;
    pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (this->current_continue_block->loop_dominator).id);
    ppVar1 = (pSVar6->declare_temporary).
             super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
             .ptr;
    sVar2 = (pSVar6->declare_temporary).
            super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
            .buffer_size;
    ppVar9 = ppVar1;
    sVar11 = sVar2;
    if (0 < (long)sVar2 >> 2) {
      lVar10 = ((long)sVar2 >> 2) + 1;
      ppVar9 = ppVar1 + 2;
      do {
        if ((ppVar9[-2].first.id == result_type) && (ppVar9[-2].second.id == local_8c.id)) {
          ppVar9 = ppVar9 + -2;
          goto LAB_001c4c9e;
        }
        if ((ppVar9[-1].first.id == result_type) && (ppVar9[-1].second.id == local_8c.id)) {
          ppVar9 = ppVar9 + -1;
          goto LAB_001c4c9e;
        }
        if (((ppVar9->first).id == result_type) && ((ppVar9->second).id == local_8c.id))
        goto LAB_001c4c9e;
        if ((ppVar9[1].first.id == result_type) && (ppVar9[1].second.id == local_8c.id)) {
          ppVar9 = ppVar9 + 1;
          goto LAB_001c4c9e;
        }
        lVar10 = lVar10 + -1;
        ppVar9 = ppVar9 + 4;
      } while (1 < lVar10);
      sVar11 = (size_t)((uint)sVar2 & 3);
      ppVar9 = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                *)((long)&(ppVar1->first).id + (sVar2 * 8 & 0xffffffffffffffe0));
    }
    if (sVar11 == 1) {
LAB_001c4c80:
      if (((ppVar9->first).id == result_type) && ((ppVar9->second).id == local_8c.id))
      goto LAB_001c4c9e;
LAB_001c4ca7:
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
      ::reserve(&pSVar6->declare_temporary,sVar2 + 1);
      ppVar9 = (pSVar6->declare_temporary).
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               .ptr;
      sVar2 = (pSVar6->declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size;
      ppVar9[sVar2].first.id = result_type;
      ppVar9[sVar2].second.id = local_8c.id;
      (pSVar6->declare_temporary).
      super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
      .buffer_size = sVar2 + 1;
      local_88[0] = &this_01->_M_h;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_01,&local_8c);
      Compiler::force_recompile(&this->super_Compiler);
    }
    else {
      if (sVar11 == 2) {
LAB_001c4c73:
        if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != local_8c.id)) {
          ppVar9 = ppVar9 + 1;
          goto LAB_001c4c80;
        }
      }
      else {
        if (sVar11 != 3) goto LAB_001c4ca7;
        if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != local_8c.id)) {
          ppVar9 = ppVar9 + 1;
          goto LAB_001c4c73;
        }
      }
LAB_001c4c9e:
      if (ppVar9 == ppVar1 + sVar2) goto LAB_001c4ca7;
    }
    pacVar8 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_88,this,(ulong)local_8c.id);
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f38c7,pacVar8
              );
  }
  puVar7 = local_78;
LAB_001c4d2e:
  if (*(undefined1 **)(puVar7 + -0x10) != puVar7) {
    operator_delete(*(undefined1 **)(puVar7 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);
	auto &flags = ir.meta[result_id].decoration.decoration_flags;

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}